

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<Js::EvalMapStringInternal<false>,Js::FunctionInfo*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<Js::EvalMapStringInternal<false>>
          (BaseDictionary<Js::EvalMapStringInternal<false>,Js::FunctionInfo*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,EvalMapStringInternal<false> *key,FunctionInfo **value)

{
  int iVar1;
  SimpleDictionaryEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
  **ppSVar2;
  WriteBarrierPtr *this_00;
  FunctionInfo **ppFVar3;
  int i;
  FunctionInfo **value_local;
  EvalMapStringInternal<false> *key_local;
  BaseDictionary<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  iVar1 = FindEntryWithKey<Js::EvalMapStringInternal<false>>(this,key);
  if (-1 < iVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SimpleDictionaryEntry__
                        ((WriteBarrierPtr *)(this + 8));
    this_00 = (WriteBarrierPtr *)
              anon_unknown_5::
              ValueEntry<Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>_>
              ::Value((ValueEntry<Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>_>
                       *)(*ppSVar2 + iVar1));
    ppFVar3 = Memory::WriteBarrierPtr::operator_cast_to_FunctionInfo__(this_00);
    *value = *ppFVar3;
  }
  return -1 < iVar1;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }